

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> *this_00;
  int iVar1;
  Maybe<kj::Own<capnp::_::SegmentReader>_&> MVar2;
  undefined4 extraout_var;
  SegmentReader *this_01;
  ulong extraout_RDX;
  SegmentReader *this_02;
  bool bVar3;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> lock;
  SegmentId local_5c;
  Own<capnp::_::SegmentReader> local_58;
  Mutex *local_48;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *local_40;
  anon_class_8_1_89918cff local_38;
  size_t local_30;
  
  if (id.value == 0) {
    this_01 = &this->segment0;
    if ((this->segment0).ptr.size_ == 0) {
      this_01 = (SegmentReader *)0x0;
    }
  }
  else {
    this_00 = &this->moreSegments;
    local_5c.value = id.value;
    kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    local_40 = &(this->moreSegments).value;
    bVar3 = (this->moreSegments).value.ptr.isSet;
    this_01 = (SegmentReader *)&(this->moreSegments).value.ptr.field_1;
    if (bVar3 == false) {
      this_01 = (SegmentReader *)0x0;
    }
    local_48 = &this_00->mutex;
    if (bVar3 == true) {
      MVar2 = kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
                        ((HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *)this_01,
                         &local_5c.value);
      bVar3 = MVar2.ptr == (Own<capnp::_::SegmentReader> *)0x0;
      this_02 = this_01;
      if (!bVar3) {
        this_01 = (MVar2.ptr)->ptr;
        this_02 = (SegmentReader *)0x0;
      }
    }
    else {
      bVar3 = true;
      this_02 = (SegmentReader *)0x0;
    }
    if (bVar3) {
      iVar1 = (*this->message->_vptr_MessageReader[2])();
      if (extraout_RDX == 0) {
        this_01 = (SegmentReader *)0x0;
      }
      else {
        local_38.size = &local_30;
        if (0x1fffffff < extraout_RDX) {
          verifySegmentSize::anon_class_8_1_89918cff::operator()(&local_38);
        }
        if ((local_40->ptr).isSet == false) {
          this_02 = (SegmentReader *)&(local_40->ptr).field_1;
          (local_40->ptr).field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
          (local_40->ptr).field_1.value.table.indexes.buckets.size_ = 0;
          *(undefined8 *)&(local_40->ptr).field_1.value.table.indexes = 0;
          (local_40->ptr).field_1.value.table.indexes.erasedCount = 0;
          (local_40->ptr).field_1.value.table.rows.builder.endPtr = (Entry *)0x0;
          (local_40->ptr).field_1.value.table.rows.builder.disposer = (ArrayDisposer *)0x0;
          (local_40->ptr).field_1.value.table.rows.builder.ptr = (Entry *)0x0;
          (local_40->ptr).field_1.value.table.rows.builder.pos =
               (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)
               0x0;
          (local_40->ptr).field_1.value.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
          (local_40->ptr).isSet = true;
        }
        this_01 = (SegmentReader *)operator_new(0x28);
        this_01->arena = &this->super_Arena;
        (this_01->id).value = local_5c.value;
        (this_01->ptr).ptr = (word *)CONCAT44(extraout_var,iVar1);
        (this_01->ptr).size_ = extraout_RDX;
        this_01->readLimiter = &this->readLimiter;
        local_58.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentReader>::instance;
        local_58.ptr = this_01;
        kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::insert
                  ((HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *)this_02,
                   local_5c.value,&local_58);
        if (local_58.ptr != (SegmentReader *)0x0) {
          local_58.ptr = (SegmentReader *)0x0;
          (**(local_58.disposer)->_vptr_Disposer)();
        }
      }
    }
    if (local_48 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(local_48,EXCLUSIVE);
    }
  }
  return this_01;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_MAYBE(s, *lock) {
    KJ_IF_MAYBE(segment, s->find(id.value)) {
      return *segment;
    }
    segments = s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegmentSize(newSegment.size());

  if (*lock == nullptr) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}